

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_statement.c
# Opt level: O2

AST * parse_finish_if_statement(Translation_Data *translation_data,Scope *scope)

{
  char cVar1;
  AST_If_Statement *error;
  AST *pAVar2;
  AST_Error *pAVar3;
  char *error_message;
  
  error = get_if_statement_tree();
  cVar1 = get_and_check(translation_data,KW_OPEN_NORMAL);
  if (cVar1 == '\0') {
    error_message = " \'(\' expected";
  }
  else {
    pAVar2 = parse_expression(translation_data,scope);
    error->condition = pAVar2;
    cVar1 = get_and_check(translation_data,KW_CLOSE_NORMAL);
    if (cVar1 != '\0') {
      pAVar2 = parse_statement(translation_data,scope);
      error->body_statement = pAVar2;
      cVar1 = get_and_check(translation_data,KW_ELSE);
      if (cVar1 == '\0') {
        error->else_statement = (AST *)0x0;
      }
      else {
        pAVar2 = parse_statement(translation_data,scope);
        error->else_statement = pAVar2;
      }
      return (AST *)error;
    }
    error_message = " \')\' expected";
  }
  push_translation_error(error_message,translation_data);
  pAVar3 = get_error_tree((AST *)error);
  return (AST *)pAVar3;
}

Assistant:

struct AST* parse_finish_if_statement(struct Translation_Data* translation_data,struct Scope *scope)
{
	struct AST_If_Statement *hold;
	hold=get_if_statement_tree();
	if(get_and_check(translation_data,KW_OPEN_NORMAL))
	{
		hold->condition=parse_expression(translation_data,scope);
		if(get_and_check(translation_data,KW_CLOSE_NORMAL))
		{
			hold->body_statement=parse_statement(translation_data,scope);
		}else
		{
			push_translation_error(" ')' expected",translation_data);
			return (struct AST*)get_error_tree((struct AST*)hold);
		}
		if(get_and_check(translation_data,KW_ELSE)) 
		{
			hold->else_statement=parse_statement(translation_data,scope);
			return (struct AST*)hold;
		}else
		{
			hold->else_statement=NULL;
			return (struct AST*)hold;
		}
	}else
	{
		push_translation_error(" '(' expected",translation_data);
		return (struct AST*)get_error_tree((struct AST*)hold);
	}
	return (struct AST*)hold;
}